

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-analyze.c
# Opt level: O0

int32_t borg_object_value_guess(borg_item_conflict *item)

{
  int local_18;
  int32_t local_14;
  wchar_t i;
  int32_t value;
  borg_item_conflict *item_local;
  
  switch(item->tval) {
  case '\x14':
  case '\x15':
    local_14 = 0x2d;
    if (item->to_a < 0) {
      local_14 = 0;
    }
    if (item->to_h < 0) {
      local_14 = 0;
    }
    if (item->to_d < 0) {
      local_14 = 0;
    }
    for (local_18 = 0; local_18 < 0x10 && local_14 != 0; local_18 = local_18 + 1) {
      if (item->modifiers[local_18] < 0) {
        local_14 = 0;
      }
    }
    break;
  case '\x16':
    local_14 = 0x46;
    break;
  case '\x17':
    local_14 = 0x32;
    break;
  case '\x18':
    local_14 = 0x5a;
    break;
  case '\x19':
    local_14 = 0x14;
    break;
  case '\x1a':
    local_14 = 0x14;
    break;
  default:
    local_14 = 0x14;
    if (item->to_a < 0) {
      local_14 = 0;
    }
    if (item->to_h < 0) {
      local_14 = 0;
    }
    if (item->to_d < 0) {
      local_14 = 0;
    }
    break;
  case '\x1c':
    local_14 = 5;
  }
  return local_14;
}

Assistant:

static int32_t borg_object_value_guess(borg_item *item)
{
    int32_t value;

    /* Guess at value */
    switch (item->tval) {
    case TV_FOOD:
        value = 5L;
        break;
    case TV_POTION:
        value = 20L;
        break;
    case TV_SCROLL:
        value = 20L;
        break;
    case TV_STAFF:
        value = 70L;
        break;
    case TV_WAND:
        value = 50L;
        break;
    case TV_ROD:
        value = 90L;
        break;
    case TV_RING:
    case TV_AMULET:
        value = 45L;

        /* Hack -- negative bonuses are bad */
        if (item->to_a < 0)
            value = 0;
        if (item->to_h < 0)
            value = 0L;
        if (item->to_d < 0)
            value = 0L;

        for (int i = 0; i < OBJ_MOD_MAX && value; i++)
            if (item->modifiers[i] < 0)
                value = 0L;

        break;
    default:
        value = 20L;

        /* Hack -- negative bonuses are bad */
        if (item->to_a < 0)
            value = 0;
        if (item->to_h < 0)
            value = 0L;
        if (item->to_d < 0)
            value = 0L;
        break;
    }

    return value;
}